

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

int cuddInsertSubtables(DdManager *unique,int n,int level)

{
  DdNode *T;
  MtrNode *treenode;
  void *__ptr;
  DdSubtable *pDVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  DdSubtable *pDVar10;
  DdSubtable *pDVar11;
  DdSubtable *__ptr_00;
  DdSubtable *pDVar12;
  DdNode *pDVar13;
  DdNode **ppDVar14;
  ulong uVar15;
  Cudd_LazyGroupType *pCVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  size_t __size;
  int *local_48;
  
  uVar20 = unique->initSlots;
  uVar15 = (ulong)uVar20;
  uVar7 = unique->size;
  iVar8 = unique->maxSize;
  lVar9 = (long)(int)uVar7;
  iVar4 = uVar7 + n;
  if (iVar8 < iVar4) {
    iVar5 = iVar4 + 10;
    lVar24 = (long)iVar5;
    pDVar10 = (DdSubtable *)malloc(lVar24 * 0x38);
    if (pDVar10 == (DdSubtable *)0x0) {
LAB_007e9c23:
      unique->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      pDVar11 = (DdSubtable *)malloc(lVar24 * 8);
      if (pDVar11 == (DdSubtable *)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        __size = lVar24 << 2;
        __ptr_00 = (DdSubtable *)malloc(__size);
        if (__ptr_00 == (DdSubtable *)0x0) {
          unique->errorCode = CUDD_MEMORY_OUT;
          free(pDVar10);
          pDVar10 = pDVar11;
        }
        else {
          pDVar12 = (DdSubtable *)malloc(__size);
          if (pDVar12 != (DdSubtable *)0x0) {
            if (unique->map == (int *)0x0) {
              local_48 = (int *)0x0;
            }
            else {
              local_48 = (int *)malloc(__size);
              if (local_48 == (int *)0x0) {
                unique->errorCode = CUDD_MEMORY_OUT;
                free(pDVar10);
                free(pDVar11);
                free(__ptr_00);
                pDVar10 = pDVar12;
                goto LAB_007e9c67;
              }
              unique->memused = unique->memused + (long)(iVar5 - iVar8) * 4;
            }
            unique->memused =
                 unique->memused + ((ulong)(uVar20 + 1) * 8 + 0x40) * (long)(iVar5 - iVar8);
            if (0 < level) {
              pDVar1 = unique->subtables;
              piVar2 = unique->perm;
              ppDVar14 = unique->vars;
              piVar3 = unique->invperm;
              lVar24 = 6;
              lVar21 = 0;
              do {
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0x24) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0x24);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0x28) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0x28);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0x20) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0x20);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0x1c) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0x1c);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0x18) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0x18);
                *(undefined8 *)((long)pDVar10 + lVar24 * 8 + -0x30) =
                     *(undefined8 *)((long)pDVar1 + lVar24 * 8 + -0x30);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0x10) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0x10);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -0xc) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -0xc);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -8) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -8);
                *(undefined4 *)((long)pDVar10 + lVar24 * 8 + -4) =
                     *(undefined4 *)((long)pDVar1 + lVar24 * 8 + -4);
                *(undefined4 *)(&pDVar10->nodelist + lVar24) =
                     *(undefined4 *)(&pDVar1->nodelist + lVar24);
                *(undefined8 *)((long)&pDVar11->nodelist + lVar21 * 2) =
                     *(undefined8 *)((long)ppDVar14 + lVar21 * 2);
                *(undefined4 *)((long)&__ptr_00->nodelist + lVar21) =
                     *(undefined4 *)((long)piVar2 + lVar21);
                *(undefined4 *)((long)&pDVar12->nodelist + lVar21) =
                     *(undefined4 *)((long)piVar3 + lVar21);
                lVar21 = lVar21 + 4;
                lVar24 = lVar24 + 7;
              } while ((ulong)(uint)level << 2 != lVar21);
            }
            if (uVar7 - level != 0 && level <= (int)uVar7) {
              piVar2 = unique->perm;
              lVar24 = (long)level;
              do {
                *(int *)((long)&__ptr_00->nodelist + lVar24 * 4) = piVar2[lVar24];
                lVar24 = lVar24 + 1;
              } while (lVar9 != lVar24);
            }
            if (0 < n) {
              lVar24 = (long)level;
              do {
                pDVar10[lVar24].slots = uVar20;
                iVar8 = cuddComputeFloorLog2(uVar20);
                pDVar10[lVar24].shift = 0x20 - iVar8;
                pDVar10[lVar24].keys = 0;
                pDVar10[lVar24].maxKeys = uVar20 * 4;
                pDVar10[lVar24].dead = 0;
                iVar8 = (uVar7 - level) + (int)lVar24;
                pDVar1 = pDVar10 + lVar24;
                pDVar1->bindVar = 0;
                pDVar1->varType = CUDD_VAR_PRIMARY_INPUT;
                *(undefined8 *)(&pDVar1->bindVar + 2) = 0;
                pDVar10[lVar24].varToBeGrouped = CUDD_LAZY_NONE;
                *(int *)((long)&__ptr_00->nodelist + (long)iVar8 * 4) = (int)lVar24;
                *(int *)((long)&pDVar12->nodelist + lVar24 * 4) = iVar8;
                ppDVar14 = (DdNode **)malloc(uVar15 * 8);
                pDVar10[lVar24].nodelist = ppDVar14;
                if (ppDVar14 == (DdNode **)0x0) {
                  unique->errorCode = CUDD_MEMORY_OUT;
                  goto LAB_007e9c6c;
                }
                if (uVar20 != 0) {
                  uVar18 = 0;
                  do {
                    ppDVar14[uVar18] = &unique->sentinel;
                    uVar18 = uVar18 + 1;
                  } while (uVar15 != uVar18);
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < n + level);
            }
            if (level < (int)uVar7) {
              pDVar1 = unique->subtables;
              lVar22 = (long)level;
              lVar21 = (long)n;
              lVar24 = lVar22 * 0x38 + 0x30;
              ppDVar14 = unique->vars;
              piVar2 = unique->invperm;
              lVar23 = 0;
              do {
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x24) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0x24);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x28) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0x28);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x20) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0x20);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x1c) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0x1c);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x18) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0x18);
                *(undefined8 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x30) =
                     *(undefined8 *)((long)pDVar1 + lVar24 + -0x30);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0x10) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0x10);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -0xc) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -0xc);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -8) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -8);
                *(undefined4 *)((long)pDVar10 + lVar24 + lVar21 * 0x38 + -4) =
                     *(undefined4 *)((long)pDVar1 + lVar24 + -4);
                *(undefined4 *)((long)&pDVar10[lVar21].nodelist + lVar24) =
                     *(undefined4 *)((long)&pDVar1->nodelist + lVar24);
                (&pDVar11->nodelist)[lVar22 + lVar23] = (DdNode **)ppDVar14[lVar22 + lVar23];
                iVar8 = piVar2[lVar22 + lVar23];
                piVar3 = (int *)((long)&__ptr_00->nodelist + (long)iVar8 * 4);
                *piVar3 = *piVar3 + n;
                *(int *)((long)&pDVar12->nodelist + lVar23 * 4 + (lVar21 + lVar22) * 4) = iVar8;
                lVar24 = lVar24 + 0x38;
                lVar23 = lVar23 + 1;
              } while (lVar9 - lVar22 != lVar23);
            }
            piVar2 = unique->map;
            if (piVar2 != (int *)0x0) {
              if (0 < (int)uVar7) {
                uVar15 = 0;
                do {
                  local_48[uVar15] = piVar2[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar7 != uVar15);
              }
              if (0 < n) {
                lVar24 = lVar9;
                do {
                  local_48[lVar24] = (int)lVar24;
                  lVar24 = lVar24 + 1;
                } while (lVar24 < iVar4);
              }
              free(piVar2);
              unique->map = local_48;
            }
            if (unique->subtables != (DdSubtable *)0x0) {
              free(unique->subtables);
              unique->subtables = (DdSubtable *)0x0;
            }
            unique->subtables = pDVar10;
            unique->maxSize = iVar5;
            if (unique->vars != (DdNode **)0x0) {
              free(unique->vars);
              unique->vars = (DdNode **)0x0;
            }
            unique->vars = (DdNode **)pDVar11;
            if (unique->perm != (int *)0x0) {
              free(unique->perm);
              unique->perm = (int *)0x0;
            }
            unique->perm = (int *)__ptr_00;
            if (unique->invperm != (int *)0x0) {
              free(unique->invperm);
              unique->invperm = (int *)0x0;
            }
            unique->invperm = (int *)pDVar12;
            if (unique->maxSizeZ < iVar5) {
              if (unique->stack != (DdNode **)0x0) {
                free(unique->stack);
                unique->stack = (DdNode **)0x0;
              }
              ppDVar14 = (DdNode **)malloc((long)iVar4 * 8 + 0x58);
              unique->stack = ppDVar14;
              if (ppDVar14 == (DdNode **)0x0) goto LAB_007e9c23;
              *ppDVar14 = (DdNode *)0x0;
              iVar8 = unique->maxSize;
              if (unique->maxSize < unique->maxSizeZ) {
                iVar8 = unique->maxSizeZ;
              }
              unique->memused = unique->memused + (long)(iVar5 - iVar8) * 8;
            }
            goto LAB_007e9434;
          }
          unique->errorCode = CUDD_MEMORY_OUT;
          free(pDVar10);
          free(pDVar11);
          pDVar10 = __ptr_00;
        }
      }
LAB_007e9c67:
      free(pDVar10);
    }
LAB_007e9c6c:
    iVar8 = 0;
  }
  else {
    if (level < (int)uVar7) {
      piVar2 = unique->invperm;
      piVar3 = unique->perm;
      lVar21 = lVar9 + n;
      pCVar16 = &unique->subtables[-1].varToBeGrouped;
      lVar24 = lVar9;
      do {
        pCVar16[lVar21 * 0xe + -9] = pCVar16[lVar9 * 0xe + -9];
        pCVar16[lVar21 * 0xe + -10] = pCVar16[lVar9 * 0xe + -10];
        pCVar16[lVar21 * 0xe + -8] = pCVar16[lVar9 * 0xe + -8];
        pCVar16[lVar21 * 0xe + -7] = pCVar16[lVar9 * 0xe + -7];
        pCVar16[lVar21 * 0xe + -6] = pCVar16[lVar9 * 0xe + -6];
        *(undefined8 *)(pCVar16 + lVar21 * 0xe + -0xc) =
             *(undefined8 *)(pCVar16 + lVar9 * 0xe + -0xc);
        pCVar16[lVar21 * 0xe + -4] = pCVar16[lVar9 * 0xe + -4];
        pCVar16[lVar21 * 0xe + -3] = pCVar16[lVar9 * 0xe + -3];
        pCVar16[lVar21 * 0xe + -2] = pCVar16[lVar9 * 0xe + -2];
        pCVar16[lVar21 * 0xe + -1] = pCVar16[lVar9 * 0xe + -1];
        pCVar16[lVar21 * 0xe] = pCVar16[lVar9 * 0xe];
        iVar8 = piVar2[lVar24 + -1];
        piVar2[(long)n + lVar24 + -1] = iVar8;
        piVar3[iVar8] = piVar3[iVar8] + n;
        lVar24 = lVar24 + -1;
        pCVar16 = pCVar16 + -0xe;
      } while (level < lVar24);
    }
    if (0 < n) {
      uVar18 = 0;
      do {
        lVar24 = (long)level + uVar18;
        unique->subtables[lVar24].slots = uVar20;
        iVar8 = cuddComputeFloorLog2(uVar20);
        pDVar10 = unique->subtables;
        pDVar10[lVar24].shift = 0x20 - iVar8;
        pDVar10[lVar24].keys = 0;
        pDVar10[lVar24].maxKeys = uVar20 * 4;
        pDVar10[lVar24].dead = 0;
        pDVar10[lVar24].varToBeGrouped = CUDD_LAZY_NONE;
        pDVar11 = pDVar10 + lVar24;
        pDVar11->bindVar = 0;
        pDVar11->varType = CUDD_VAR_PRIMARY_INPUT;
        *(undefined8 *)(&pDVar11->bindVar + 2) = 0;
        unique->perm[lVar9 + uVar18] = (int)lVar24;
        unique->invperm[lVar24] = (int)(lVar9 + uVar18);
        ppDVar14 = (DdNode **)malloc(uVar15 * 8);
        pDVar10[lVar24].nodelist = ppDVar14;
        if (ppDVar14 == (DdNode **)0x0) {
          unique->errorCode = CUDD_MEMORY_OUT;
          goto LAB_007e9c6c;
        }
        if (uVar20 != 0) {
          uVar17 = 0;
          do {
            ppDVar14[uVar17] = &unique->sentinel;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uint)n);
    }
    piVar2 = unique->map;
    if (0 < n && piVar2 != (int *)0x0) {
      uVar15 = 0;
      do {
        piVar2[lVar9 + uVar15] = uVar7 + (int)uVar15;
        uVar15 = uVar15 + 1;
      } while ((uint)n != uVar15);
    }
LAB_007e9434:
    uVar6 = unique->slots + uVar20 * n;
    unique->slots = uVar6;
    unique->minDead = (uint)(long)((double)uVar6 * unique->gcFrac);
    uVar19 = unique->maxCacheHard;
    if (uVar6 * 4 < unique->maxCacheHard) {
      uVar19 = uVar6 * 4;
    }
    iVar8 = uVar19 + unique->cacheSlots * -2;
    unique->cacheSlack = iVar8;
    if (-1 < iVar8 && unique->cacheSlots < uVar6 >> 1) {
      cuddCacheResize(unique);
    }
    unique->size = unique->size + n;
    T = unique->one;
    iVar8 = unique->autoDyn;
    unique->autoDyn = 0;
    if (0 < n) {
      lVar24 = lVar9;
      do {
        iVar5 = (int)lVar24;
        pDVar13 = cuddUniqueInter(unique,iVar5,T,(DdNode *)((ulong)T ^ 1));
        unique->vars[lVar24] = pDVar13;
        if (unique->vars[lVar24] == (DdNode *)0x0) {
          unique->autoDyn = iVar8;
          if ((int)uVar7 < iVar5) {
            lVar24 = lVar9;
            do {
              Cudd_IterDerefBdd(unique,unique->vars[lVar24]);
              ppDVar14 = unique->vars;
              ppDVar14[lVar24]->next = unique->nextFree;
              unique->nextFree = ppDVar14[lVar24];
              ppDVar14[lVar24] = (DdNode *)0x0;
              lVar24 = lVar24 + 1;
            } while (iVar5 != lVar24);
          }
          if (level < (int)uVar7) {
            lVar21 = (long)level;
            lVar24 = lVar21 * 0x38;
            do {
              pDVar10 = unique->subtables;
              *(undefined4 *)((long)&pDVar10->slots + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].slots + lVar24);
              *(undefined4 *)((long)&pDVar10->shift + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].shift + lVar24);
              *(undefined4 *)((long)&pDVar10->keys + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].keys + lVar24);
              *(undefined4 *)((long)&pDVar10->maxKeys + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].maxKeys + lVar24);
              *(undefined4 *)((long)&pDVar10->dead + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].dead + lVar24);
              __ptr = *(void **)((long)&pDVar10->nodelist + lVar24);
              if (__ptr != (void *)0x0) {
                free(__ptr);
                *(undefined8 *)((long)&unique->subtables->nodelist + lVar24) = 0;
              }
              pDVar10 = unique->subtables;
              *(undefined8 *)((long)&pDVar10->nodelist + lVar24) =
                   *(undefined8 *)((long)&pDVar10[(uint)n].nodelist + lVar24);
              *(undefined8 *)((long)&pDVar10[(uint)n].nodelist + lVar24) = 0;
              *(undefined4 *)((long)&pDVar10->bindVar + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].bindVar + lVar24);
              *(undefined4 *)((long)&pDVar10->varType + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].varType + lVar24);
              *(undefined4 *)((long)&pDVar10->pairIndex + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].pairIndex + lVar24);
              *(undefined4 *)((long)&pDVar10->varHandled + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].varHandled + lVar24);
              *(undefined4 *)((long)&pDVar10->varToBeGrouped + lVar24) =
                   *(undefined4 *)((long)&pDVar10[(uint)n].varToBeGrouped + lVar24);
              iVar8 = unique->invperm[lVar21 + (ulong)(uint)n];
              unique->invperm[lVar21] = iVar8;
              unique->perm[iVar8] = unique->perm[iVar8] - n;
              lVar21 = lVar21 + 1;
              lVar24 = lVar24 + 0x38;
            } while (lVar9 != lVar21);
          }
          unique->size = uVar7;
          uVar7 = unique->slots - uVar20 * n;
          unique->slots = uVar7;
          unique->minDead = (uint)(long)((double)uVar7 * unique->gcFrac);
          uVar20 = unique->maxCacheHard;
          if (uVar7 * 4 < unique->maxCacheHard) {
            uVar20 = uVar7 * 4;
          }
          iVar8 = uVar20 + unique->cacheSlots * -2;
          unique->cacheSlack = iVar8;
          if (-1 < iVar8 && unique->cacheSlots < uVar7 >> 1) {
            cuddCacheResize(unique);
          }
          Cudd_DebugCheck(unique);
          goto LAB_007e9c6c;
        }
        piVar2 = (int *)(((ulong)unique->vars[lVar24] & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        lVar24 = lVar24 + 1;
      } while (lVar24 < iVar4);
    }
    treenode = unique->tree;
    if (treenode != (MtrNode *)0x0) {
      treenode->size = treenode->size + n;
      treenode->index = *unique->invperm;
      ddPatchTree(unique,treenode);
    }
    unique->autoDyn = iVar8;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int
cuddInsertSubtables(
  DdManager * unique,
  int  n,
  int  level)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    DdNodePtr *newvars;
    DdNode *sentinel = &(unique->sentinel);
    int oldsize,newsize;
    int i,j,index,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm, *newmap=NULL;
    DdNode *one, *zero;

#ifdef DD_DEBUG
    assert(n > 0 && level < unique->size);
#endif

    oldsize = unique->size;
    /* Easy case: there is still room in the current table. */
    if (oldsize + n <= unique->maxSize) {
        /* Shift the tables at and below level. */
        for (i = oldsize - 1; i >= level; i--) {
            unique->subtables[i+n].slots    = unique->subtables[i].slots;
            unique->subtables[i+n].shift    = unique->subtables[i].shift;
            unique->subtables[i+n].keys     = unique->subtables[i].keys;
            unique->subtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            unique->subtables[i+n].dead     = unique->subtables[i].dead;
            unique->subtables[i+n].nodelist = unique->subtables[i].nodelist;
            unique->subtables[i+n].bindVar  = unique->subtables[i].bindVar;
            unique->subtables[i+n].varType  = unique->subtables[i].varType;
            unique->subtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            unique->subtables[i+n].varHandled = unique->subtables[i].varHandled;
            unique->subtables[i+n].varToBeGrouped =
                unique->subtables[i].varToBeGrouped;

            index                           = unique->invperm[i];
            unique->invperm[i+n]            = index;
            unique->perm[index]            += n;
        }
        /* Create new subtables. */
        for (i = 0; i < n; i++) {
            unique->subtables[level+i].slots = numSlots;
            unique->subtables[level+i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtables[level+i].keys = 0;
            unique->subtables[level+i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtables[level+i].dead = 0;
            unique->subtables[level+i].bindVar = 0;
            unique->subtables[level+i].varType = CUDD_VAR_PRIMARY_INPUT;
            unique->subtables[level+i].pairIndex = 0;
            unique->subtables[level+i].varHandled = 0;
            unique->subtables[level+i].varToBeGrouped = CUDD_LAZY_NONE;

            unique->perm[oldsize+i] = level + i;
            unique->invperm[level+i] = oldsize + i;
            newnodelist = unique->subtables[level+i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        if (unique->map != NULL) {
            for (i = 0; i < n; i++) {
                unique->map[oldsize+i] = oldsize + i;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables.
        */
        newsize = oldsize + n + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the table size from %d to %d\n",
            unique->maxSize, newsize);
#endif
        /* Allocate memory for new arrays (except nodelists). */
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newvars = ABC_ALLOC(DdNodePtr,newsize);
        if (newvars == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            ABC_FREE(newperm);
            return(0);
        }
        if (unique->map != NULL) {
            newmap = ABC_ALLOC(int,newsize);
            if (newmap == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(newsubtables);
                ABC_FREE(newvars);
                ABC_FREE(newperm);
                ABC_FREE(newinvperm);
                return(0);
            }
            unique->memused += (newsize - unique->maxSize) * sizeof(int);
        }
        unique->memused += (newsize - unique->maxSize) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        /* Copy levels before insertion points from old tables. */
        for (i = 0; i < level; i++) {
            newsubtables[i].slots = unique->subtables[i].slots;
            newsubtables[i].shift = unique->subtables[i].shift;
            newsubtables[i].keys = unique->subtables[i].keys;
            newsubtables[i].maxKeys = unique->subtables[i].maxKeys;
            newsubtables[i].dead = unique->subtables[i].dead;
            newsubtables[i].nodelist = unique->subtables[i].nodelist;
            newsubtables[i].bindVar = unique->subtables[i].bindVar;
            newsubtables[i].varType = unique->subtables[i].varType;
            newsubtables[i].pairIndex = unique->subtables[i].pairIndex;
            newsubtables[i].varHandled = unique->subtables[i].varHandled;
            newsubtables[i].varToBeGrouped = unique->subtables[i].varToBeGrouped;

            newvars[i] = unique->vars[i];
            newperm[i] = unique->perm[i];
            newinvperm[i] = unique->invperm[i];
        }
        /* Finish initializing permutation for new table to old one. */
        for (i = level; i < oldsize; i++) {
            newperm[i] = unique->perm[i];
        }
        /* Initialize new levels. */
        for (i = level; i < level + n; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newsubtables[i].bindVar = 0;
            newsubtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
            newsubtables[i].pairIndex = 0;
            newsubtables[i].varHandled = 0;
            newsubtables[i].varToBeGrouped = CUDD_LAZY_NONE;

            newperm[oldsize + i - level] = i;
            newinvperm[i] = oldsize + i - level;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                /* We are going to leak some memory.  We should clean up. */
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        /* Copy the old tables for levels past the insertion point. */
        for (i = level; i < oldsize; i++) {
            newsubtables[i+n].slots    = unique->subtables[i].slots;
            newsubtables[i+n].shift    = unique->subtables[i].shift;
            newsubtables[i+n].keys     = unique->subtables[i].keys;
            newsubtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            newsubtables[i+n].dead     = unique->subtables[i].dead;
            newsubtables[i+n].nodelist = unique->subtables[i].nodelist;
            newsubtables[i+n].bindVar  = unique->subtables[i].bindVar;
            newsubtables[i+n].varType  = unique->subtables[i].varType;
            newsubtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            newsubtables[i+n].varHandled  = unique->subtables[i].varHandled;
            newsubtables[i+n].varToBeGrouped  =
                unique->subtables[i].varToBeGrouped;

            newvars[i]                 = unique->vars[i];
            index                      = unique->invperm[i];
            newinvperm[i+n]            = index;
            newperm[index]            += n;
        }
        /* Update the map. */
        if (unique->map != NULL) {
            for (i = 0; i < oldsize; i++) {
                newmap[i] = unique->map[i];
            }
            for (i = oldsize; i < oldsize + n; i++) {
                newmap[i] = i;
            }
            ABC_FREE(unique->map);
            unique->map = newmap;
        }
        /* Install the new tables and free the old ones. */
        ABC_FREE(unique->subtables);
        unique->subtables = newsubtables;
        unique->maxSize = newsize;
        ABC_FREE(unique->vars);
        unique->vars = newvars;
        ABC_FREE(unique->perm);
        unique->perm = newperm;
        ABC_FREE(unique->invperm);
        unique->invperm = newinvperm;
        /* Update the stack for iterative procedures. */
        if (newsize > unique->maxSizeZ) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
    }
    /* Update manager parameters to account for the new subtables. */
    unique->slots += n * numSlots;
    ddFixLimits(unique);
    unique->size += n;

    /* Now that the table is in a coherent state, create the new
    ** projection functions. We need to temporarily disable reordering,
    ** because we cannot reorder without projection functions in place.
    **/
    one = unique->one;
    zero = Cudd_Not(one);

    reorderSave = unique->autoDyn;
    unique->autoDyn = 0;
    for (i = oldsize; i < oldsize + n; i++) {
        unique->vars[i] = cuddUniqueInter(unique,i,one,zero);
        if (unique->vars[i] == NULL) {
            unique->autoDyn = reorderSave;
            /* Shift everything back so table remains coherent. */
            for (j = oldsize; j < i; j++) {
                Cudd_IterDerefBdd(unique,unique->vars[j]);
                cuddDeallocNode(unique,unique->vars[j]);
                unique->vars[j] = NULL;
            }
            for (j = level; j < oldsize; j++) {
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].shift    = unique->subtables[j+n].shift;
                unique->subtables[j].keys     = unique->subtables[j+n].keys;
                unique->subtables[j].maxKeys  =
                    unique->subtables[j+n].maxKeys;
                unique->subtables[j].dead     = unique->subtables[j+n].dead;
                ABC_FREE(unique->subtables[j].nodelist);
                unique->subtables[j].nodelist =
                    unique->subtables[j+n].nodelist;
                unique->subtables[j+n].nodelist = NULL;
                unique->subtables[j].bindVar  =
                    unique->subtables[j+n].bindVar;
                unique->subtables[j].varType  =
                    unique->subtables[j+n].varType;
                unique->subtables[j].pairIndex =
                    unique->subtables[j+n].pairIndex;
                unique->subtables[j].varHandled =
                    unique->subtables[j+n].varHandled;
                unique->subtables[j].varToBeGrouped =
                    unique->subtables[j+n].varToBeGrouped;
                index                         = unique->invperm[j+n];
                unique->invperm[j]            = index;
                unique->perm[index]          -= n;
            }
            unique->size = oldsize;
            unique->slots -= n * numSlots;
            ddFixLimits(unique);
            (void) Cudd_DebugCheck(unique);
            return(0);
        }
        cuddRef(unique->vars[i]);
    }
    if (unique->tree != NULL) {
        unique->tree->size += n;
        unique->tree->index = unique->invperm[0];
        ddPatchTree(unique,unique->tree);
    }
    unique->autoDyn = reorderSave;

    return(1);

}